

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle_p_p.h
# Opt level: O2

QColor __thiscall QFusionStylePrivate::buttonColor(QFusionStylePrivate *this,QPalette *pal)

{
  undefined8 uVar1;
  QColor QVar2;
  QRgb rgb;
  int iVar3;
  int iVar4;
  int iVar5;
  QBrush *pQVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  undefined8 local_38;
  undefined4 uStack_30;
  undefined2 uStack_2c;
  undefined2 uStack_2a;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = QPalette::button(pal);
  local_38 = *(undefined8 *)(*(long *)pQVar6 + 8);
  uVar1 = *(undefined8 *)(*(long *)pQVar6 + 0x10);
  uStack_30 = (undefined4)uVar1;
  uStack_2c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_2a = (undefined2)((ulong)uVar1 >> 0x30);
  rgb = QColor::rgb();
  qGray(rgb);
  auVar7 = QColor::lighter((int)&local_38);
  local_38 = auVar7._0_8_;
  uStack_30 = auVar7._8_4_;
  uStack_2c = auVar7._12_2_;
  iVar3 = QColor::hue();
  iVar4 = QColor::saturation();
  iVar5 = QColor::value();
  QColor::setHsv((int)&local_38,iVar3,(int)((double)iVar4 * 0.75),iVar5);
  QVar2.ct._4_4_ = uStack_30;
  QVar2._0_8_ = local_38;
  QVar2.ct.argb.pad = uStack_2c;
  QVar2._14_2_ = uStack_2a;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor buttonColor(const QPalette &pal) const {
        QColor buttonColor = pal.button().color();
        int val = qGray(buttonColor.rgb());
        buttonColor = buttonColor.lighter(100 + qMax(1, (180 - val)/6));
        buttonColor.setHsv(buttonColor.hue(), buttonColor.saturation() * 0.75, buttonColor.value());
        return buttonColor;
    }